

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O0

void __thiscall ON_RTree::RemoveAllRec(ON_RTree *this,ON_RTreeNode *a_node)

{
  bool bVar1;
  int local_1c;
  int index;
  ON_RTreeNode *a_node_local;
  ON_RTree *this_local;
  
  bVar1 = ON_RTreeNode::IsInternalNode(a_node);
  if (bVar1) {
    for (local_1c = 0; local_1c < a_node->m_count; local_1c = local_1c + 1) {
      RemoveAllRec(this,a_node->m_branch[local_1c].field_1.m_child);
    }
  }
  ON_RTreeMemPool::FreeNode(&this->m_mem_pool,a_node);
  return;
}

Assistant:

void ON_RTree::RemoveAllRec(ON_RTreeNode* a_node)
{
  if(a_node->IsInternalNode()) // This is an internal node in the tree
  {
    for(int index=0; index < a_node->m_count; ++index)
    {
      RemoveAllRec(a_node->m_branch[index].m_child);
    }
  }
  m_mem_pool.FreeNode(a_node); 
}